

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerSettings.cpp
# Opt level: O0

char * __thiscall JtagAnalyzerSettings::SaveSettings(JtagAnalyzerSettings *this)

{
  char *pcVar1;
  SimpleArchive local_18 [8];
  SimpleArchive text_archive;
  JtagAnalyzerSettings *this_local;
  
  _text_archive = this;
  SimpleArchive::SimpleArchive(local_18);
  SimpleArchive::operator<<(local_18,&this->mTmsChannel);
  SimpleArchive::operator<<(local_18,&this->mTckChannel);
  SimpleArchive::operator<<(local_18,&this->mTdiChannel);
  SimpleArchive::operator<<(local_18,&this->mTdoChannel);
  SimpleArchive::operator<<(local_18,&this->mTrstChannel);
  SimpleArchive::operator<<(local_18,this->mTAPInitialState);
  SimpleArchive::operator<<(local_18,this->mInstructRegBitOrder);
  SimpleArchive::operator<<(local_18,this->mDataRegBitOrder);
  SimpleArchive::operator<<(local_18,this->mShiftDRBitsPerDataUnit);
  SimpleArchive::operator<<(local_18,(bool)(this->mShowBitCount & 1));
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(local_18);
  return pcVar1;
}

Assistant:

const char* JtagAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << mTmsChannel;
    text_archive << mTckChannel;
    text_archive << mTdiChannel;
    text_archive << mTdoChannel;
    text_archive << mTrstChannel;
    text_archive << int( mTAPInitialState );
    text_archive << int( mInstructRegBitOrder );
    text_archive << int( mDataRegBitOrder );
    text_archive << mShiftDRBitsPerDataUnit;

    text_archive << mShowBitCount; // added after 1.2.3

    return SetReturnString( text_archive.GetString() );
}